

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPSources::MultipleTimeouts
          (RTPSources *this,RTPTime *curtime,RTPTime *sendertimeout,RTPTime *byetimeout,
          RTPTime *generaltimeout,RTPTime *notetimeout)

{
  RTPInternalSourceData *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  RTPInternalSourceData **ppRVar7;
  RTPMemoryManager *mgr;
  RTPTime local_a0;
  RTPTime lastrtppacktime;
  RTPTime lastmsgtime;
  RTPTime byetime;
  RTPTime notetime;
  size_t notelen;
  bool notetimeout_1;
  bool normaltimeout;
  bool byetimeout_1;
  bool isactive;
  bool issender;
  bool deleted;
  RTPInternalSourceData *srcdat;
  RTPTime notechecktime;
  RTPTime generaltchecktime;
  RTPTime byechecktime;
  RTPTime senderchecktime;
  int local_40;
  int newactivecount;
  int newsendercount;
  int newtotalcount;
  RTPTime *notetimeout_local;
  RTPTime *generaltimeout_local;
  RTPTime *byetimeout_local;
  RTPTime *sendertimeout_local;
  RTPTime *curtime_local;
  RTPSources *this_local;
  
  newactivecount = 0;
  local_40 = 0;
  senderchecktime.m_t._4_4_ = 0;
  byechecktime = (RTPTime)curtime->m_t;
  generaltchecktime = (RTPTime)curtime->m_t;
  notechecktime = (RTPTime)curtime->m_t;
  srcdat = (RTPInternalSourceData *)curtime->m_t;
  RTPTime::operator-=(&byechecktime,sendertimeout);
  RTPTime::operator-=(&generaltchecktime,byetimeout);
  RTPTime::operator-=(&notechecktime,generaltimeout);
  RTPTime::operator-=((RTPTime *)&srcdat,notetimeout);
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while (bVar3 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
                 ::HasCurrentElement(&this->sourcelist), bVar3) {
    ppRVar7 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    this_00 = *ppRVar7;
    bVar4 = RTPSourceData::IsSender(&this_00->super_RTPSourceData);
    bVar5 = RTPSourceData::IsActive(&this_00->super_RTPSourceData);
    bVar3 = false;
    bVar1 = false;
    bVar2 = false;
    notelen._2_1_ = false;
    RTPSourceData::SDES_GetNote(&this_00->super_RTPSourceData,(size_t *)&notetime);
    if (notetime.m_t != 0.0) {
      byetime = RTPSourceData::INF_GetLastSDESNoteTime(&this_00->super_RTPSourceData);
      notelen._2_1_ = RTPTime::operator>((RTPTime *)&srcdat,&byetime);
      if (notelen._2_1_) {
        RTPInternalSourceData::ClearNote(this_00);
      }
    }
    bVar6 = RTPSourceData::ReceivedBYE(&this_00->super_RTPSourceData);
    if (((bVar6) &&
        (lastmsgtime = RTPSourceData::GetBYETime(&this_00->super_RTPSourceData),
        this_00 != this->owndata)) &&
       (bVar6 = RTPTime::operator>(&generaltchecktime,&lastmsgtime), bVar6)) {
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::DeleteCurrentElement(&this->sourcelist);
      bVar3 = true;
      bVar1 = true;
    }
    if (((!bVar3) &&
        (lastrtppacktime = RTPSourceData::INF_GetLastMessageTime(&this_00->super_RTPSourceData),
        this_00 != this->owndata)) &&
       (bVar6 = RTPTime::operator<(&lastrtppacktime,&notechecktime), bVar6)) {
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::DeleteCurrentElement(&this->sourcelist);
      bVar3 = true;
      bVar2 = true;
    }
    if (bVar3) {
      if (bVar4) {
        this->sendercount = this->sendercount + -1;
      }
      if (bVar5) {
        this->activecount = this->activecount + -1;
      }
      this->totalcount = this->totalcount + -1;
      if (bVar1) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,this_00);
      }
      if (bVar2) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[8])(this,this_00);
      }
      (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,this_00);
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPInternalSourceData>(this_00,mgr);
    }
    else {
      newactivecount = newactivecount + 1;
      if (bVar4) {
        local_a0 = RTPSourceData::INF_GetLastRTPPacketTime(&this_00->super_RTPSourceData);
        bVar3 = RTPTime::operator<(&local_a0,&byechecktime);
        if (bVar3) {
          RTPInternalSourceData::ClearSenderFlag(this_00);
          this->sendercount = this->sendercount + -1;
        }
        else {
          local_40 = local_40 + 1;
        }
      }
      if (bVar5) {
        senderchecktime.m_t._4_4_ = senderchecktime.m_t._4_4_ + 1;
      }
      if (notelen._2_1_ != false) {
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x12])(this,this_00);
      }
      RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
      ::GotoNextElement(&this->sourcelist);
    }
  }
  this->totalcount = newactivecount;
  this->sendercount = local_40;
  this->activecount = senderchecktime.m_t._4_4_;
  return;
}

Assistant:

void RTPSources::MultipleTimeouts(const RTPTime &curtime,const RTPTime &sendertimeout,const RTPTime &byetimeout,const RTPTime &generaltimeout,const RTPTime &notetimeout)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime senderchecktime = curtime;
	RTPTime byechecktime = curtime;
	RTPTime generaltchecktime = curtime;
	RTPTime notechecktime = curtime;
	senderchecktime -= sendertimeout;
	byechecktime -= byetimeout;
	generaltchecktime -= generaltimeout;
	notechecktime -= notetimeout;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		bool deleted,issender,isactive;
		bool byetimeout,normaltimeout,notetimeout;
		
		size_t notelen;
		
		issender = srcdat->IsSender();
		isactive = srcdat->IsActive();
		deleted = false;
		byetimeout = false;
		normaltimeout = false;
		notetimeout = false;

        	srcdat->SDES_GetNote(&notelen);
		if (notelen != 0) // Note has been set
		{
			RTPTime notetime = srcdat->INF_GetLastSDESNoteTime();
			
			if (notechecktime > notetime)
			{
				notetimeout = true;
				srcdat->ClearNote();
			}
		}

		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (byechecktime > byetime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				byetimeout = true;
			}
		}

		if (!deleted)
		{
			RTPTime lastmsgtime = srcdat->INF_GetLastMessageTime();

			if ((srcdat != owndata) && (lastmsgtime < generaltchecktime))
			{
				sourcelist.DeleteCurrentElement();
				deleted = true;
				normaltimeout = true;
			}
		}
		
		if (!deleted)
		{
			newtotalcount++;
			
			if (issender)
			{
				RTPTime lastrtppacktime = srcdat->INF_GetLastRTPPacketTime();

				if (lastrtppacktime < senderchecktime)
				{
					srcdat->ClearSenderFlag();
					sendercount--;
				}
				else
					newsendercount++;
			}

			if (isactive)
				newactivecount++;

			if (notetimeout)
				OnNoteTimeout(srcdat);

			sourcelist.GotoNextElement();
		}
		else // deleted entry
		{
			if (issender)
				sendercount--;
			if (isactive)
				activecount--;
			totalcount--;

			if (byetimeout)
				OnBYETimeout(srcdat);
			if (normaltimeout)
				OnTimeout(srcdat);
			OnRemoveSource(srcdat);
			RTPDelete(srcdat,GetMemoryManager());
		}
	}	
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		SafeCountTotal();
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
	}
	if (newsendercount != sendercount)
	{
		SafeCountSenders();
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}